

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

void Diligent::InputLayoutDesc_To_VkVertexInputStateCI
               (InputLayoutDesc *LayoutDesc,VkPipelineVertexInputStateCreateInfo *VertexInputStateCI
               ,VkPipelineVertexInputDivisorStateCreateInfoEXT *VertexInputDivisorCI,
               array<VkVertexInputBindingDescription,_16UL> *BindingDescriptions,
               array<VkVertexInputAttributeDescription,_16UL> *AttributeDescription,
               array<VkVertexInputBindingDivisorDescription,_16UL> *VertexBindingDivisors)

{
  uint32_t uVar1;
  uint uVar2;
  LayoutElement *pLVar3;
  uint uVar4;
  VkVertexInputRate VVar5;
  VkVertexInputRate VVar6;
  VkFormat VVar7;
  pointer pvVar8;
  pointer pvVar9;
  pointer pvVar10;
  uint32_t *puVar11;
  reference pvVar12;
  Char *pCVar13;
  reference pvVar14;
  reference pvVar15;
  VkVertexInputBindingDivisorDescriptionEXT *AttribDivisor;
  VkVertexInputAttributeDescription *AttribDesc;
  string msg_2;
  string msg_1;
  undefined1 local_c0 [8];
  string msg;
  VkVertexInputBindingDescription *BindingDesc;
  VkVertexInputBindingDescription *BindingDesc_1;
  Int32 *BindingDescInd;
  LayoutElement *LayoutElem;
  Uint32 elem;
  array<int,_16UL> BufferSlot2BindingDescInd;
  array<VkVertexInputBindingDivisorDescription,_16UL> *VertexBindingDivisors_local;
  array<VkVertexInputAttributeDescription,_16UL> *AttributeDescription_local;
  array<VkVertexInputBindingDescription,_16UL> *BindingDescriptions_local;
  VkPipelineVertexInputDivisorStateCreateInfoEXT *VertexInputDivisorCI_local;
  VkPipelineVertexInputStateCreateInfo *VertexInputStateCI_local;
  InputLayoutDesc *LayoutDesc_local;
  
  VertexInputStateCI->sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  VertexInputStateCI->pNext = (void *)0x0;
  VertexInputStateCI->flags = 0;
  VertexInputStateCI->vertexBindingDescriptionCount = 0;
  BufferSlot2BindingDescInd._M_elems._56_8_ = VertexBindingDivisors;
  pvVar8 = std::array<VkVertexInputBindingDescription,_16UL>::data(BindingDescriptions);
  VertexInputStateCI->pVertexBindingDescriptions = pvVar8;
  VertexInputStateCI->vertexAttributeDescriptionCount = LayoutDesc->NumElements;
  pvVar9 = std::array<VkVertexInputAttributeDescription,_16UL>::data(AttributeDescription);
  VertexInputStateCI->pVertexAttributeDescriptions = pvVar9;
  VertexInputDivisorCI->sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO;
  VertexInputDivisorCI->pNext = (void *)0x0;
  VertexInputDivisorCI->vertexBindingDivisorCount = 0;
  pvVar10 = std::array<VkVertexInputBindingDivisorDescription,_16UL>::data
                      ((array<VkVertexInputBindingDivisorDescription,_16UL> *)
                       BufferSlot2BindingDescInd._M_elems._56_8_);
  VertexInputDivisorCI->pVertexBindingDivisors = pvVar10;
  LayoutElem._4_4_ = 0xffffffff;
  std::array<int,_16UL>::fill
            ((array<int,_16UL> *)&elem,(value_type_conflict5 *)((long)&LayoutElem + 4));
  for (LayoutElem._0_4_ = 0; uVar4 = (uint)LayoutElem, (uint)LayoutElem < LayoutDesc->NumElements;
      LayoutElem._0_4_ = (uint)LayoutElem + 1) {
    pLVar3 = LayoutDesc->LayoutElements;
    puVar11 = (uint32_t *)
              std::array<int,_16UL>::operator[]
                        ((array<int,_16UL> *)&elem,(ulong)pLVar3[(uint)LayoutElem].BufferSlot);
    if ((int)*puVar11 < 0) {
      uVar1 = VertexInputStateCI->vertexBindingDescriptionCount;
      VertexInputStateCI->vertexBindingDescriptionCount = uVar1 + 1;
      *puVar11 = uVar1;
      pvVar12 = std::array<VkVertexInputBindingDescription,_16UL>::operator[]
                          (BindingDescriptions,(long)(int)*puVar11);
      pvVar12->binding = pLVar3[uVar4].BufferSlot;
      pvVar12->stride = pLVar3[uVar4].Stride;
      VVar5 = LayoutElemFrequencyToVkInputRate(pLVar3[uVar4].Frequency);
      pvVar12->inputRate = VVar5;
    }
    msg.field_2._8_8_ =
         std::array<VkVertexInputBindingDescription,_16UL>::operator[]
                   (BindingDescriptions,(long)(int)*puVar11);
    if (((reference)msg.field_2._8_8_)->binding != pLVar3[uVar4].BufferSlot) {
      FormatString<char[25]>((string *)local_c0,(char (*) [25])"Inconsistent buffer slot");
      pCVar13 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar13,"InputLayoutDesc_To_VkVertexInputStateCI",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x40d);
      std::__cxx11::string::~string((string *)local_c0);
    }
    if (*(Uint32 *)(msg.field_2._8_8_ + 4) != pLVar3[uVar4].Stride) {
      FormatString<char[21]>
                ((string *)((long)&msg_2.field_2 + 8),(char (*) [21])"Inconsistent strides");
      pCVar13 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar13,"InputLayoutDesc_To_VkVertexInputStateCI",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x40e);
      std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    }
    VVar5 = *(VkVertexInputRate *)(msg.field_2._8_8_ + 8);
    VVar6 = LayoutElemFrequencyToVkInputRate(pLVar3[uVar4].Frequency);
    if (VVar5 != VVar6) {
      FormatString<char[38]>
                ((string *)&AttribDesc,(char (*) [38])"Inconsistent layout element frequency");
      pCVar13 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar13,"InputLayoutDesc_To_VkVertexInputStateCI",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                 ,0x40f);
      std::__cxx11::string::~string((string *)&AttribDesc);
    }
    pvVar14 = std::array<VkVertexInputAttributeDescription,_16UL>::operator[]
                        (AttributeDescription,(ulong)(uint)LayoutElem);
    pvVar14->binding = *(uint32_t *)msg.field_2._8_8_;
    pvVar14->location = pLVar3[uVar4].InputIndex;
    VVar7 = TypeToVkFormat(pLVar3[uVar4].ValueType,pLVar3[uVar4].NumComponents,
                           (Bool)(pLVar3[uVar4].IsNormalized & 1));
    pvVar14->format = VVar7;
    pvVar14->offset = pLVar3[uVar4].RelativeOffset;
    if ((pLVar3[uVar4].Frequency == INPUT_ELEMENT_FREQUENCY_PER_INSTANCE) &&
       (pLVar3[uVar4].InstanceDataStepRate != 1)) {
      uVar2 = VertexInputDivisorCI->vertexBindingDivisorCount;
      VertexInputDivisorCI->vertexBindingDivisorCount = uVar2 + 1;
      pvVar15 = std::array<VkVertexInputBindingDivisorDescription,_16UL>::operator[]
                          ((array<VkVertexInputBindingDivisorDescription,_16UL> *)
                           BufferSlot2BindingDescInd._M_elems._56_8_,(ulong)uVar2);
      pvVar15->binding = *(uint32_t *)msg.field_2._8_8_;
      pvVar15->divisor = pLVar3[uVar4].InstanceDataStepRate;
    }
  }
  return;
}

Assistant:

void InputLayoutDesc_To_VkVertexInputStateCI(const InputLayoutDesc&                                                      LayoutDesc,
                                             VkPipelineVertexInputStateCreateInfo&                                       VertexInputStateCI,
                                             VkPipelineVertexInputDivisorStateCreateInfoEXT&                             VertexInputDivisorCI,
                                             std::array<VkVertexInputBindingDescription, MAX_LAYOUT_ELEMENTS>&           BindingDescriptions,
                                             std::array<VkVertexInputAttributeDescription, MAX_LAYOUT_ELEMENTS>&         AttributeDescription,
                                             std::array<VkVertexInputBindingDivisorDescriptionEXT, MAX_LAYOUT_ELEMENTS>& VertexBindingDivisors)
{
    // Vertex input description
    VertexInputStateCI.sType                           = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
    VertexInputStateCI.pNext                           = nullptr;
    VertexInputStateCI.flags                           = 0; // reserved for future use.
    VertexInputStateCI.vertexBindingDescriptionCount   = 0;
    VertexInputStateCI.pVertexBindingDescriptions      = BindingDescriptions.data();
    VertexInputStateCI.vertexAttributeDescriptionCount = LayoutDesc.NumElements;
    VertexInputStateCI.pVertexAttributeDescriptions    = AttributeDescription.data();

    VertexInputDivisorCI.sType                     = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO_EXT;
    VertexInputDivisorCI.pNext                     = nullptr;
    VertexInputDivisorCI.vertexBindingDivisorCount = 0;
    VertexInputDivisorCI.pVertexBindingDivisors    = VertexBindingDivisors.data();

    std::array<Int32, MAX_LAYOUT_ELEMENTS> BufferSlot2BindingDescInd;
    BufferSlot2BindingDescInd.fill(-1);
    for (Uint32 elem = 0; elem < LayoutDesc.NumElements; ++elem)
    {
        const LayoutElement& LayoutElem     = LayoutDesc.LayoutElements[elem];
        Int32&               BindingDescInd = BufferSlot2BindingDescInd[LayoutElem.BufferSlot];
        if (BindingDescInd < 0)
        {
            BindingDescInd = VertexInputStateCI.vertexBindingDescriptionCount++;
            VkVertexInputBindingDescription& BindingDesc{BindingDescriptions[BindingDescInd]};
            BindingDesc.binding   = LayoutElem.BufferSlot;
            BindingDesc.stride    = LayoutElem.Stride;
            BindingDesc.inputRate = LayoutElemFrequencyToVkInputRate(LayoutElem.Frequency);
        }

        const VkVertexInputBindingDescription& BindingDesc = BindingDescriptions[BindingDescInd];
        VERIFY(BindingDesc.binding == LayoutElem.BufferSlot, "Inconsistent buffer slot");
        VERIFY(BindingDesc.stride == LayoutElem.Stride, "Inconsistent strides");
        VERIFY(BindingDesc.inputRate == LayoutElemFrequencyToVkInputRate(LayoutElem.Frequency), "Inconsistent layout element frequency");

        VkVertexInputAttributeDescription& AttribDesc{AttributeDescription[elem]};
        AttribDesc.binding  = BindingDesc.binding;
        AttribDesc.location = LayoutElem.InputIndex;
        AttribDesc.format   = TypeToVkFormat(LayoutElem.ValueType, LayoutElem.NumComponents, LayoutElem.IsNormalized);
        AttribDesc.offset   = LayoutElem.RelativeOffset;

        if (LayoutElem.Frequency == INPUT_ELEMENT_FREQUENCY_PER_INSTANCE && LayoutElem.InstanceDataStepRate != 1)
        {
            VkVertexInputBindingDivisorDescriptionEXT& AttribDivisor{VertexBindingDivisors[VertexInputDivisorCI.vertexBindingDivisorCount++]};
            AttribDivisor.binding = BindingDesc.binding;
            AttribDivisor.divisor = LayoutElem.InstanceDataStepRate;
        }
    }
}